

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O2

TPZSavable * __thiscall
TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle>_>::Restore
          (TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle>_> *this)

{
  TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle> *this_00;
  
  this_00 = (TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle> *)operator_new(0x128);
  TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle>::TPZGeoElement(this_00);
  return (TPZSavable *)
         (&(((TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)
            (&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).fGeo + -2))->super_TPZGeoEl).
           field_0x0 +
         *(long *)(*(long *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl
                  + -0x60));
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }